

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  __node_base _Var5;
  _Hash_node_base *p_Var6;
  uint uVar7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  undefined1 local_2d8 [28];
  undefined4 uStack_2bc;
  _Bit_pointer local_2b8;
  undefined4 local_2a8;
  Column_settings settings;
  char *local_2a0;
  char *local_298;
  shared_count sStack_290;
  void *local_288;
  undefined4 local_280;
  long local_278;
  uint local_270;
  long local_268;
  size_type local_260;
  undefined4 *local_258;
  size_type *local_250;
  undefined **local_248;
  ulong uStack_240;
  undefined8 *local_238;
  size_type **local_230;
  undefined **local_220;
  ulong local_218;
  shared_count sStack_210;
  char *local_208;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>
  col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  undefined4 **local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_288 = (void *)0x0;
  local_280 = 0;
  local_278 = 0;
  local_270 = 0;
  local_268 = 0;
  local_248 = (undefined **)0x100000000;
  uStack_240 = 0x500000002;
  local_238 = (undefined8 *)CONCAT44(local_238._4_4_,6);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_248;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d8,__l,
             (allocator_type *)&local_220);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>
              *)&col,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d8,&settings);
  if ((_Bit_type *)local_2d8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2d8._0_8_,
                    CONCAT44(local_2d8._20_4_,local_2d8._16_4_) - local_2d8._0_8_);
  }
  local_2d8._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_288,local_2d8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x290);
  uVar7 = ((int)local_278 - (int)local_288) * 8 + local_270;
  if ((int)uVar7 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var5 = col.column_._M_h._M_before_begin;
      for (p_Var2 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
        p_Var6 = p_Var2;
        if (*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt <= *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt) {
          p_Var6 = _Var5._M_nxt;
        }
        _Var5._M_nxt = p_Var6;
      }
      uVar7 = *(int *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_001c8daf;
    }
    local_2d8._16_4_ = 0;
    local_2d8._20_4_ = 0;
    local_2d8._24_4_ = 0;
    uStack_2bc = 0;
    local_2d8._0_8_ = (_Bit_type *)0x0;
    local_2d8._8_4_ = 0;
    local_2d8._12_4_ = 0;
    local_2b8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001c8daf:
    local_248 = (undefined **)((ulong)local_248 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2d8,(long)(int)uVar7,(bool *)&local_248,
               (allocator_type *)&local_2a0);
    for (_Var5 = col.column_._M_h._M_before_begin; _Var5._M_nxt != (_Hash_node_base *)0x0;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      uVar1 = *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt;
      if (uVar1 < uVar7) {
        *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) =
             *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) | 1L << ((byte)uVar1 & 0x3f);
      }
    }
  }
  __last1.super__Bit_iterator_base._M_p._4_4_ = local_2d8._20_4_;
  __last1.super__Bit_iterator_base._M_p._0_4_ = local_2d8._16_4_;
  __last1.super__Bit_iterator_base._M_offset = local_2d8._24_4_;
  if ((ulong)(uint)local_2d8._24_4_ +
      (CONCAT44(local_2d8._20_4_,local_2d8._16_4_) - local_2d8._0_8_) * 8 ==
      (ulong)local_270 + (local_278 - (long)local_288) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)local_2d8._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_288;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  local_220 = (undefined **)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_230 = (size_type **)&local_2a0;
  local_2a0 = "col.get_content(veccont.size()) == veccont";
  local_298 = "";
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002293b0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_248,&local_60,0x290,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if ((_Bit_type *)local_2d8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2d8._0_8_,(long)local_2b8 - local_2d8._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x291);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = &PTR__lazy_ostream_00229440;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_180 = &local_258;
  local_258 = (undefined4 *)col.column_._M_h._M_element_count;
  local_250 = &local_260;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,col.column_._M_h._M_element_count == 5);
  local_260 = CONCAT44(local_260._4_4_,5);
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_a64d0;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1e7951;
  unique0x00005300 = &local_180;
  local_2d8._8_4_ = local_2d8._8_4_ & 0xffffff00;
  local_2d8._0_8_ = &PTR__lazy_ostream_00229400;
  local_2d8._16_4_ = 0x231120;
  local_2d8._20_4_ = 0;
  local_230 = &local_250;
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002296c0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,&local_220,&permutation,0x291,1,2,2,"col.size()",local_2d8,"5",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_2d8._16_4_ = 1;
  local_2d8._20_4_ = 4;
  local_2d8._24_4_ = 6;
  local_2d8._0_8_ = (_Bit_type *)0x500000000;
  local_2d8._8_4_ = 2;
  local_2d8._12_4_ = 3;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)local_2d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&permutation,__l_00,(allocator_type *)&local_248);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>
              *)&col,&permutation,0xffffffff);
  local_2d8._0_7_ = 0x1010100010001;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_288,local_2d8);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x296);
  uVar7 = ((int)local_278 - (int)local_288) * 8 + local_270;
  if ((int)uVar7 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var5 = col.column_._M_h._M_before_begin;
      for (p_Var2 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
        p_Var6 = p_Var2;
        if (*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt <= *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt) {
          p_Var6 = _Var5._M_nxt;
        }
        _Var5._M_nxt = p_Var6;
      }
      uVar7 = *(int *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_001c8e0f;
    }
    local_2d8._16_4_ = 0;
    local_2d8._20_4_ = 0;
    local_2d8._24_4_ = 0;
    uStack_2bc = 0;
    local_2d8._0_8_ = (_Bit_type *)0x0;
    local_2d8._8_4_ = 0;
    local_2d8._12_4_ = 0;
    local_2b8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001c8e0f:
    local_248 = (undefined **)((ulong)local_248 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2d8,(long)(int)uVar7,(bool *)&local_248,
               (allocator_type *)&local_2a0);
    for (_Var5 = col.column_._M_h._M_before_begin; _Var5._M_nxt != (_Hash_node_base *)0x0;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      uVar1 = *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt;
      if (uVar1 < uVar7) {
        *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) =
             *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) | 1L << ((byte)uVar1 & 0x3f);
      }
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = local_2d8._20_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = local_2d8._16_4_;
  __last1_00.super__Bit_iterator_base._M_offset = local_2d8._24_4_;
  if ((ulong)(uint)local_2d8._24_4_ +
      (CONCAT44(local_2d8._20_4_,local_2d8._16_4_) - local_2d8._0_8_) * 8 ==
      (ulong)local_270 + (local_278 - (long)local_288) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_2d8._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_288;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar4 = false;
  }
  local_220 = (undefined **)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_2a0 = "col.get_content(veccont.size()) == veccont";
  local_298 = "";
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002293b0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_230 = (size_type **)&local_2a0;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_248,&local_b0,0x296,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if ((_Bit_type *)local_2d8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2d8._0_8_,(long)local_2b8 - local_2d8._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x297);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = &PTR__lazy_ostream_00229440;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_260 = col.column_._M_h._M_element_count;
  local_258 = &local_2a8;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,col.column_._M_h._M_element_count == 5);
  local_2a8 = 5;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e78de;
  local_178 = "";
  local_250 = &local_260;
  local_2d8._8_4_ = local_2d8._8_4_ & 0xffffff00;
  local_2d8._0_8_ = &PTR__lazy_ostream_00229400;
  local_2d8._16_4_ = 0x231120;
  local_2d8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_250;
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002296c0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (size_type **)&local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,&local_220,&local_180,0x297,1,2,2,"col.size()",local_2d8,"5",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_290);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>
  ::clear(&col,2);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>
  ::clear(&col,6);
  local_2d8._0_7_ = 0x10100000001;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_288,local_2d8);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x29c);
  uVar7 = ((int)local_278 - (int)local_288) * 8 + local_270;
  if ((int)uVar7 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var5 = col.column_._M_h._M_before_begin;
      for (p_Var2 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
        p_Var6 = p_Var2;
        if (*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt <= *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt) {
          p_Var6 = _Var5._M_nxt;
        }
        _Var5._M_nxt = p_Var6;
      }
      uVar7 = *(int *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_001c8e6f;
    }
    local_2d8._16_4_ = 0;
    local_2d8._20_4_ = 0;
    unique0x10000e5c = (undefined4 ***)0x0;
    local_2d8._0_8_ = (_Bit_type *)0x0;
    local_2d8._8_4_ = 0;
    local_2d8._12_4_ = 0;
    local_2b8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001c8e6f:
    local_248 = (undefined **)((ulong)local_248 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2d8,(long)(int)uVar7,(bool *)&local_248,
               (allocator_type *)&local_2a0);
    for (_Var5 = col.column_._M_h._M_before_begin; _Var5._M_nxt != (_Hash_node_base *)0x0;
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      uVar1 = *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt;
      if (uVar1 < uVar7) {
        *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) =
             *(ulong *)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) | 1L << ((byte)uVar1 & 0x3f);
      }
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = local_2d8._20_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = local_2d8._16_4_;
  __last1_01.super__Bit_iterator_base._M_offset = local_2d8._24_4_;
  if (((ulong)unique0x10000e54 & 0xffffffff) +
      (CONCAT44(local_2d8._20_4_,local_2d8._16_4_) - local_2d8._0_8_) * 8 ==
      (ulong)local_270 + (local_278 - (long)local_288) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_2d8._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_288;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar4 = false;
  }
  local_220 = (undefined **)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_2a0 = "col.get_content(veccont.size()) == veccont";
  local_298 = "";
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002293b0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_230 = (size_type **)&local_2a0;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_248,&local_100,0x29c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if ((_Bit_type *)local_2d8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2d8._0_8_,(long)local_2b8 - local_2d8._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x29d);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = &PTR__lazy_ostream_00229440;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_260 = col.column_._M_h._M_element_count;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,col.column_._M_h._M_element_count == 3);
  local_2a8 = 3;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e78de;
  local_178 = "";
  local_250 = &local_260;
  local_2d8._8_4_ = local_2d8._8_4_ & 0xffffff00;
  local_2d8._0_8_ = &PTR__lazy_ostream_00229400;
  local_2d8._16_4_ = 0x231120;
  local_2d8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_250;
  local_258 = &local_2a8;
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002296c0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (size_type **)&local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,&local_220,&local_180,0x29d,1,2,2,"col.size()",local_2d8,"3",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_290);
  _Var5 = col.column_._M_h._M_before_begin;
  if (col.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = _Var5._M_nxt[1]._M_nxt;
      if (((col.super_Row_access_option.rows_ != (Row_container *)0x0) ||
          (p_Var2 != (_Hash_node_base *)0x0)) &&
         (p_Var6 = p_Var2[1]._M_nxt, p_Var6 != (_Hash_node_base *)0x0)) {
        p_Var3 = p_Var2[2]._M_nxt;
        p_Var3->_M_nxt = p_Var6;
        p_Var6[1]._M_nxt = p_Var3;
      }
      operator_delete(p_Var2,0x20);
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
    } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
    while (col.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      p_Var2 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
      operator_delete(col.column_._M_h._M_before_begin._M_nxt,0x18);
      col.column_._M_h._M_before_begin._M_nxt = p_Var2;
    }
  }
  memset(col.column_._M_h._M_buckets,0,col.column_._M_h._M_bucket_count << 3);
  col.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  col.column_._M_h._M_element_count = 0;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_288,0,0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2a1);
  uVar7 = ((int)local_278 - (int)local_288) * 8 + local_270;
  if ((int)uVar7 < 0) {
    if (col.column_._M_h._M_element_count == 0) {
      local_2d8._16_4_ = 0;
      local_2d8._20_4_ = 0;
      unique0x10000e6c = (undefined4 ***)0x0;
      local_2d8._0_8_ = (undefined **)0x0;
      local_2d8._8_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2b8 = (_Bit_pointer)0x0;
      goto LAB_001c8aec;
    }
    _Var5 = col.column_._M_h._M_before_begin;
    for (p_Var2 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      p_Var6 = p_Var2;
      if (*(uint *)&p_Var2[1]._M_nxt[3]._M_nxt <= *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt) {
        p_Var6 = _Var5._M_nxt;
      }
      _Var5._M_nxt = p_Var6;
    }
    uVar7 = *(int *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt + 1;
  }
  local_248 = (undefined **)((ulong)local_248 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_2d8,(long)(int)uVar7,(bool *)&local_248,
             (allocator_type *)&local_2a0);
  for (_Var5 = col.column_._M_h._M_before_begin; _Var5._M_nxt != (_Hash_node_base *)0x0;
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    uVar1 = *(uint *)&_Var5._M_nxt[1]._M_nxt[3]._M_nxt;
    if (uVar1 < uVar7) {
      *(undefined **)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) =
           (undefined *)
           ((ulong)*(undefined **)(local_2d8._0_8_ + (ulong)(uVar1 >> 6) * 8) |
           1L << ((byte)uVar1 & 0x3f));
    }
  }
LAB_001c8aec:
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = local_2d8._20_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = local_2d8._16_4_;
  __last1_02.super__Bit_iterator_base._M_offset = local_2d8._24_4_;
  if (((ulong)unique0x10000e64 & 0xffffffff) +
      (CONCAT44(local_2d8._20_4_,local_2d8._16_4_) - local_2d8._0_8_) * 8 ==
      (ulong)local_270 + (local_278 - (long)local_288) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_2d8._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_288;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar4 = false;
  }
  local_220 = (undefined **)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_2a0 = "col.get_content(veccont.size()) == veccont";
  local_298 = "";
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002293b0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_230 = (size_type **)&local_2a0;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_248,&local_150,0x2a1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if ((undefined **)local_2d8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_2d8._0_8_,(long)local_2b8 - local_2d8._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x2a2);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = &PTR__lazy_ostream_00229440;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_260 = col.column_._M_h._M_element_count;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,col.column_._M_h._M_element_count == 0);
  local_2a8 = 0;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e78de;
  local_178 = "";
  local_250 = &local_260;
  local_2d8._8_4_ = local_2d8._8_4_ & 0xffffff00;
  local_2d8._0_8_ = &PTR__lazy_ostream_00229400;
  local_2d8._16_4_ = 0x231120;
  local_2d8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_250;
  local_258 = &local_2a8;
  uStack_240 = uStack_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_002296c0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (size_type **)&local_258;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  _Var5 = col.column_._M_h._M_before_begin;
  if (permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var5 = col.column_._M_h._M_before_begin;
  }
  for (; _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
    p_Var2 = _Var5._M_nxt[1]._M_nxt;
    if (((col.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var2 != (_Hash_node_base *)0x0)) &&
       (p_Var6 = p_Var2[1]._M_nxt, p_Var6 != (_Hash_node_base *)0x0)) {
      p_Var3 = p_Var2[2]._M_nxt;
      p_Var3->_M_nxt = p_Var6;
      p_Var6[1]._M_nxt = p_Var3;
    }
    operator_delete(p_Var2,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col.column_._M_h);
  if (local_288 != (void *)0x0) {
    operator_delete(local_288,local_268 - (long)local_288);
  }
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}